

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert-llama2c-to-ggml.cpp
# Opt level: O2

void __thiscall my_llama_file::read_raw(my_llama_file *this,void *ptr,size_t size)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (size == 0) {
    return;
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  sVar3 = fread(ptr,size,1,(FILE *)this->fp);
  iVar1 = ferror((FILE *)this->fp);
  __stream = _stderr;
  if (iVar1 == 0) {
    if (sVar3 == 1) {
      return;
    }
    fputs("error: unexpectedly reached end of file\n",_stderr);
  }
  else {
    pcVar4 = strerror(*piVar2);
    fprintf(__stream,"error: fread failed: %s\n",pcVar4);
  }
  exit(1);
}

Assistant:

void read_raw(void * ptr, size_t size) {
        if (size == 0) {
            return;
        }
        errno = 0;
        std::size_t ret = std::fread(ptr, size, 1, fp);
        if (ferror(fp)) {
            die_fmt("fread failed: %s", strerror(errno));
        }
        if (ret != 1) {
            die("unexpectedly reached end of file");
        }
    }